

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

int BZ2_bzBuffToBuffDecompress
              (char *dest,uint *destLen,char *source,uint sourceLen,int small,int verbosity)

{
  undefined1 auStack_88 [4];
  int ret;
  bz_stream strm;
  int verbosity_local;
  int small_local;
  uint sourceLen_local;
  char *source_local;
  uint *destLen_local;
  char *dest_local;
  
  if ((((dest == (char *)0x0) || (destLen == (uint *)0x0)) || (source == (char *)0x0)) ||
     (((small != 0 && (small != 1)) || ((verbosity < 0 || (4 < verbosity)))))) {
    dest_local._4_4_ = -2;
  }
  else {
    strm.state = (void *)0x0;
    strm.bzalloc = (_func_void_ptr_void_ptr_int_int *)0x0;
    strm.bzfree = (_func_void_void_ptr_void_ptr *)0x0;
    strm.opaque._4_4_ = verbosity;
    dest_local._4_4_ = BZ2_bzDecompressInit((bz_stream *)auStack_88,verbosity,small);
    if (dest_local._4_4_ == 0) {
      strm.next_out._0_4_ = *destLen;
      _auStack_88 = source;
      strm.next_in._0_4_ = sourceLen;
      strm._16_8_ = dest;
      dest_local._4_4_ = BZ2_bzDecompress((bz_stream *)auStack_88);
      if (dest_local._4_4_ == 0) {
        if ((uint)strm.next_out == 0) {
          BZ2_bzDecompressEnd((bz_stream *)auStack_88);
          dest_local._4_4_ = -8;
        }
        else {
          BZ2_bzDecompressEnd((bz_stream *)auStack_88);
          dest_local._4_4_ = -7;
        }
      }
      else if (dest_local._4_4_ == 4) {
        *destLen = *destLen - (uint)strm.next_out;
        BZ2_bzDecompressEnd((bz_stream *)auStack_88);
        dest_local._4_4_ = 0;
      }
      else {
        BZ2_bzDecompressEnd((bz_stream *)auStack_88);
      }
    }
  }
  return dest_local._4_4_;
}

Assistant:

int BZ2_bzBuffToBuffDecompress 
                           ( char*         dest, 
                             unsigned int* destLen,
                             char*         source, 
                             unsigned int  sourceLen,
                             int           small,
                             int           verbosity )
{
   bz_stream strm;
   int ret;

   if (dest == NULL || destLen == NULL || 
       source == NULL ||
       (small != 0 && small != 1) ||
       verbosity < 0 || verbosity > 4) 
          return BZ_PARAM_ERROR;

   strm.bzalloc = NULL;
   strm.bzfree = NULL;
   strm.opaque = NULL;
   ret = BZ2_bzDecompressInit ( &strm, verbosity, small );
   if (ret != BZ_OK) return ret;

   strm.next_in = source;
   strm.next_out = dest;
   strm.avail_in = sourceLen;
   strm.avail_out = *destLen;

   ret = BZ2_bzDecompress ( &strm );
   if (ret == BZ_OK) goto output_overflow_or_eof;
   if (ret != BZ_STREAM_END) goto errhandler;

   /* normal termination */
   *destLen -= strm.avail_out;
   BZ2_bzDecompressEnd ( &strm );
   return BZ_OK;

   output_overflow_or_eof:
   if (strm.avail_out > 0) {
      BZ2_bzDecompressEnd ( &strm );
      return BZ_UNEXPECTED_EOF;
   } else {
      BZ2_bzDecompressEnd ( &strm );
      return BZ_OUTBUFF_FULL;
   };      

   errhandler:
   BZ2_bzDecompressEnd ( &strm );
   return ret; 
}